

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neural_net.cpp
# Opt level: O1

double __thiscall Net::accuracy(Net *this,Table *Xtest,Table *Ytest)

{
  undefined1 auVar1 [16];
  int iVar2;
  ostream *poVar3;
  int r_row;
  int l_row;
  double dVar4;
  ulong extraout_XMM0_Qb;
  undefined1 auVar5 [16];
  char local_145;
  int local_144;
  Table *local_140;
  Net *local_138;
  double local_130;
  double local_128;
  ulong uStack_120;
  undefined4 local_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  Table local_100;
  Table local_98;
  
  local_138 = this;
  local_144 = Table::get_rows(Xtest);
  if (local_144 < 1) {
    dVar4 = 0.0;
  }
  else {
    local_118 = 0;
    uStack_114 = 0;
    uStack_110 = 0;
    uStack_10c = 0;
    local_140 = &local_98;
    l_row = 0;
    do {
      iVar2 = Table::get_cols(Xtest);
      r_row = l_row + 1;
      Table::slice(&local_98,Xtest,0,iVar2,l_row,r_row);
      iVar2 = predict(local_138,&local_98);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar2);
      local_145 = ' ';
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_145,1);
      dVar4 = Table::get_value(Ytest,0,l_row);
      poVar3 = std::ostream::_M_insert<double>(dVar4);
      local_145 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_145,1);
      Table::~Table(&local_98);
      iVar2 = Table::get_cols(Xtest);
      Table::slice(&local_100,Xtest,0,iVar2,l_row,r_row);
      iVar2 = predict(local_138,&local_100);
      local_128 = Table::get_value(Ytest,0,l_row);
      local_130 = (double)iVar2;
      uStack_120 = extraout_XMM0_Qb;
      Table::~Table(&local_100);
      auVar5._0_8_ = ~-(ulong)(local_128 == local_130) & CONCAT44(uStack_114,local_118);
      auVar5._8_8_ = ~uStack_120 & CONCAT44(uStack_10c,uStack_110);
      auVar1._8_8_ = CONCAT44(uStack_10c,uStack_110) & uStack_120;
      auVar1._0_8_ = (ulong)((double)CONCAT44(uStack_114,local_118) + 1.0) &
                     -(ulong)(local_128 == local_130);
      auVar5 = auVar5 | auVar1;
      dVar4 = auVar5._0_8_;
      local_118 = auVar5._0_4_;
      uStack_114 = auVar5._4_4_;
      uStack_110 = auVar5._8_4_;
      uStack_10c = auVar5._12_4_;
      l_row = r_row;
    } while (r_row != local_144);
  }
  return dVar4 / (double)local_144;
}

Assistant:

double Net::accuracy(Table &Xtest, Table &Ytest) {
    int tests = Xtest.get_rows();
    double TrueAnswers = 0;
    for (int i = 0; i < tests; ++i){
        std::cout << predict(Xtest.slice(0, Xtest.get_cols(), i, i + 1)) << ' ' << Ytest.get_value(0, i) << '\n';
        if (predict(Xtest.slice(0, Xtest.get_cols(), i, i + 1)) == Ytest.get_value(0, i))
            TrueAnswers++;
    }
    return TrueAnswers / (double)tests;
}